

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  byte bVar1;
  xpath_ast_node *pxVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte *pbVar10;
  long lVar11;
  char_t *__dest;
  char cVar12;
  byte *pbVar13;
  xpath_ast_node *pxVar14;
  ulong uVar15;
  byte bVar16;
  bool bVar17;
  undefined1 in_XMM0_Bi;
  undefined1 extraout_XMM0_Bi;
  undefined1 extraout_XMM0_Bi_00;
  undefined1 extraout_XMM0_Bi_01;
  undefined1 extraout_XMM0_Bi_02;
  undefined1 in_XMM0_Bj;
  undefined1 extraout_XMM0_Bj;
  undefined1 extraout_XMM0_Bj_00;
  undefined1 extraout_XMM0_Bj_01;
  undefined1 extraout_XMM0_Bj_02;
  undefined1 in_XMM0_Bk;
  undefined1 extraout_XMM0_Bk;
  undefined1 extraout_XMM0_Bk_00;
  undefined1 extraout_XMM0_Bk_01;
  undefined1 extraout_XMM0_Bk_02;
  undefined1 in_XMM0_Bl;
  undefined1 extraout_XMM0_Bl;
  undefined1 extraout_XMM0_Bl_00;
  undefined1 extraout_XMM0_Bl_01;
  undefined1 extraout_XMM0_Bl_02;
  undefined1 in_XMM0_Bm;
  undefined1 extraout_XMM0_Bm;
  undefined1 extraout_XMM0_Bm_00;
  undefined1 extraout_XMM0_Bm_01;
  undefined1 extraout_XMM0_Bm_02;
  undefined1 in_XMM0_Bn;
  undefined1 extraout_XMM0_Bn;
  undefined1 extraout_XMM0_Bn_00;
  undefined1 extraout_XMM0_Bn_01;
  undefined1 extraout_XMM0_Bn_02;
  undefined1 in_XMM0_Bo;
  undefined1 extraout_XMM0_Bo;
  undefined1 extraout_XMM0_Bo_00;
  undefined1 extraout_XMM0_Bo_01;
  undefined1 extraout_XMM0_Bo_02;
  undefined1 in_XMM0_Bp;
  undefined1 extraout_XMM0_Bp;
  undefined1 extraout_XMM0_Bp_00;
  undefined1 extraout_XMM0_Bp_01;
  undefined1 extraout_XMM0_Bp_02;
  byte local_a8 [136];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi;
    in_XMM0_Bj = extraout_XMM0_Bj;
    in_XMM0_Bk = extraout_XMM0_Bk;
    in_XMM0_Bl = extraout_XMM0_Bl;
    in_XMM0_Bm = extraout_XMM0_Bm;
    in_XMM0_Bn = extraout_XMM0_Bn;
    in_XMM0_Bo = extraout_XMM0_Bo;
    in_XMM0_Bp = extraout_XMM0_Bp;
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi_00;
    in_XMM0_Bj = extraout_XMM0_Bj_00;
    in_XMM0_Bk = extraout_XMM0_Bk_00;
    in_XMM0_Bl = extraout_XMM0_Bl_00;
    in_XMM0_Bm = extraout_XMM0_Bm_00;
    in_XMM0_Bn = extraout_XMM0_Bn_00;
    in_XMM0_Bo = extraout_XMM0_Bo_00;
    in_XMM0_Bp = extraout_XMM0_Bp_00;
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi_01;
    in_XMM0_Bj = extraout_XMM0_Bj_01;
    in_XMM0_Bk = extraout_XMM0_Bk_01;
    in_XMM0_Bl = extraout_XMM0_Bl_01;
    in_XMM0_Bm = extraout_XMM0_Bm_01;
    in_XMM0_Bn = extraout_XMM0_Bn_01;
    in_XMM0_Bo = extraout_XMM0_Bo_01;
    in_XMM0_Bp = extraout_XMM0_Bp_01;
  }
  bVar1 = this->_type;
  if ((bVar1 & 0xfe) != 0x10) goto LAB_00128513;
  pxVar2 = this->_right;
  if ((((pxVar2 != (xpath_ast_node *)0x0) && (pxVar2->_type == '\x03')) &&
      (pxVar2->_left->_type == '\x16')) && (pxVar2->_right->_rettype == '\x02')) {
    this->_right = pxVar2->_right;
  }
  pxVar2 = this->_right;
  if (pxVar2 == (xpath_ast_node *)0x0) goto LAB_00128513;
  if (pxVar2->_type == '\x13') {
    in_XMM0_Bi = 0;
    in_XMM0_Bj = 0;
    in_XMM0_Bk = 0;
    in_XMM0_Bl = 0;
    in_XMM0_Bm = 0;
    in_XMM0_Bn = 0;
    in_XMM0_Bo = 0;
    in_XMM0_Bp = 0;
    cVar12 = '\x03';
    if (((pxVar2->_data).number != 1.0) || (NAN((pxVar2->_data).number))) goto LAB_001284f4;
  }
  else {
LAB_001284f4:
    cVar12 = '\x02';
    if (2 < (byte)(pxVar2->_type - 0x13U) || pxVar2->_rettype != '\x02') {
      if (pxVar2->_rettype == '\x02') goto LAB_00128513;
      bVar17 = is_posinv_expr(pxVar2);
      cVar12 = '\x01';
      in_XMM0_Bi = extraout_XMM0_Bi_02;
      in_XMM0_Bj = extraout_XMM0_Bj_02;
      in_XMM0_Bk = extraout_XMM0_Bk_02;
      in_XMM0_Bl = extraout_XMM0_Bl_02;
      in_XMM0_Bm = extraout_XMM0_Bm_02;
      in_XMM0_Bn = extraout_XMM0_Bn_02;
      in_XMM0_Bo = extraout_XMM0_Bo_02;
      in_XMM0_Bp = extraout_XMM0_Bp_02;
      if (!bVar17) goto LAB_00128513;
    }
  }
  this->_test = cVar12;
LAB_00128513:
  if (bVar1 == 0x2c) {
    pxVar2 = this->_right;
    if (((pxVar2 != (xpath_ast_node *)0x0) && (pxVar2->_type == '\x12')) &&
       (pxVar2->_next->_type == '\x12')) {
      pbVar10 = (pxVar2->_data).table;
      pbVar13 = (pxVar2->_next->_data).table;
      uVar15 = CONCAT17(in_XMM0_Bp,
                        CONCAT16(in_XMM0_Bo,
                                 CONCAT15(in_XMM0_Bn,
                                          CONCAT14(in_XMM0_Bm,
                                                   CONCAT13(in_XMM0_Bl,
                                                            CONCAT12(in_XMM0_Bk,
                                                                     CONCAT11(in_XMM0_Bj,in_XMM0_Bi)
                                                                    )))))) ^
               CONCAT17(in_XMM0_Bp,
                        CONCAT16(in_XMM0_Bo,
                                 CONCAT15(in_XMM0_Bn,
                                          CONCAT14(in_XMM0_Bm,
                                                   CONCAT13(in_XMM0_Bl,
                                                            CONCAT12(in_XMM0_Bk,
                                                                     CONCAT11(in_XMM0_Bj,in_XMM0_Bi)
                                                                    ))))));
      local_a8[0x78] = (byte)uVar15;
      local_a8[0x79] = (byte)(uVar15 >> 8);
      local_a8[0x7a] = (byte)(uVar15 >> 0x10);
      local_a8[0x7b] = (byte)(uVar15 >> 0x18);
      local_a8[0x7c] = (byte)(uVar15 >> 0x20);
      local_a8[0x7d] = (byte)(uVar15 >> 0x28);
      local_a8[0x7e] = (byte)(uVar15 >> 0x30);
      local_a8[0x7f] = (byte)(uVar15 >> 0x38);
      local_a8[0x70] = 0;
      local_a8[0x71] = 0;
      local_a8[0x72] = 0;
      local_a8[0x73] = 0;
      local_a8[0x74] = 0;
      local_a8[0x75] = 0;
      local_a8[0x76] = 0;
      local_a8[0x77] = 0;
      local_a8[0x60] = 0;
      local_a8[0x61] = 0;
      local_a8[0x62] = 0;
      local_a8[99] = 0;
      local_a8[100] = 0;
      local_a8[0x65] = 0;
      local_a8[0x66] = 0;
      local_a8[0x67] = 0;
      local_a8[0x68] = local_a8[0x78];
      local_a8[0x69] = local_a8[0x79];
      local_a8[0x6a] = local_a8[0x7a];
      local_a8[0x6b] = local_a8[0x7b];
      local_a8[0x6c] = local_a8[0x7c];
      local_a8[0x6d] = local_a8[0x7d];
      local_a8[0x6e] = local_a8[0x7e];
      local_a8[0x6f] = local_a8[0x7f];
      local_a8[0x50] = 0;
      local_a8[0x51] = 0;
      local_a8[0x52] = 0;
      local_a8[0x53] = 0;
      local_a8[0x54] = 0;
      local_a8[0x55] = 0;
      local_a8[0x56] = 0;
      local_a8[0x57] = 0;
      local_a8[0x58] = local_a8[0x78];
      local_a8[0x59] = local_a8[0x79];
      local_a8[0x5a] = local_a8[0x7a];
      local_a8[0x5b] = local_a8[0x7b];
      local_a8[0x5c] = local_a8[0x7c];
      local_a8[0x5d] = local_a8[0x7d];
      local_a8[0x5e] = local_a8[0x7e];
      local_a8[0x5f] = local_a8[0x7f];
      local_a8[0x40] = 0;
      local_a8[0x41] = 0;
      local_a8[0x42] = 0;
      local_a8[0x43] = 0;
      local_a8[0x44] = 0;
      local_a8[0x45] = 0;
      local_a8[0x46] = 0;
      local_a8[0x47] = 0;
      local_a8[0x48] = local_a8[0x78];
      local_a8[0x49] = local_a8[0x79];
      local_a8[0x4a] = local_a8[0x7a];
      local_a8[0x4b] = local_a8[0x7b];
      local_a8[0x4c] = local_a8[0x7c];
      local_a8[0x4d] = local_a8[0x7d];
      local_a8[0x4e] = local_a8[0x7e];
      local_a8[0x4f] = local_a8[0x7f];
      local_a8[0x30] = 0;
      local_a8[0x31] = 0;
      local_a8[0x32] = 0;
      local_a8[0x33] = 0;
      local_a8[0x34] = 0;
      local_a8[0x35] = 0;
      local_a8[0x36] = 0;
      local_a8[0x37] = 0;
      local_a8[0x38] = local_a8[0x78];
      local_a8[0x39] = local_a8[0x79];
      local_a8[0x3a] = local_a8[0x7a];
      local_a8[0x3b] = local_a8[0x7b];
      local_a8[0x3c] = local_a8[0x7c];
      local_a8[0x3d] = local_a8[0x7d];
      local_a8[0x3e] = local_a8[0x7e];
      local_a8[0x3f] = local_a8[0x7f];
      local_a8[0x20] = 0;
      local_a8[0x21] = 0;
      local_a8[0x22] = 0;
      local_a8[0x23] = 0;
      local_a8[0x24] = 0;
      local_a8[0x25] = 0;
      local_a8[0x26] = 0;
      local_a8[0x27] = 0;
      local_a8[0x28] = local_a8[0x78];
      local_a8[0x29] = local_a8[0x79];
      local_a8[0x2a] = local_a8[0x7a];
      local_a8[0x2b] = local_a8[0x7b];
      local_a8[0x2c] = local_a8[0x7c];
      local_a8[0x2d] = local_a8[0x7d];
      local_a8[0x2e] = local_a8[0x7e];
      local_a8[0x2f] = local_a8[0x7f];
      local_a8[0x10] = 0;
      local_a8[0x11] = 0;
      local_a8[0x12] = 0;
      local_a8[0x13] = 0;
      local_a8[0x14] = 0;
      local_a8[0x15] = 0;
      local_a8[0x16] = 0;
      local_a8[0x17] = 0;
      local_a8[0x18] = local_a8[0x78];
      local_a8[0x19] = local_a8[0x79];
      local_a8[0x1a] = local_a8[0x7a];
      local_a8[0x1b] = local_a8[0x7b];
      local_a8[0x1c] = local_a8[0x7c];
      local_a8[0x1d] = local_a8[0x7d];
      local_a8[0x1e] = local_a8[0x7e];
      local_a8[0x1f] = local_a8[0x7f];
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[8] = local_a8[0x78];
      local_a8[9] = local_a8[0x79];
      local_a8[10] = local_a8[0x7a];
      local_a8[0xb] = local_a8[0x7b];
      local_a8[0xc] = local_a8[0x7c];
      local_a8[0xd] = local_a8[0x7d];
      local_a8[0xe] = local_a8[0x7e];
      local_a8[0xf] = local_a8[0x7f];
      __dest = (char_t *)0x0;
      while( true ) {
        uVar15 = (ulong)*pbVar10;
        if (uVar15 == 0) break;
        bVar1 = *pbVar13;
        bVar17 = -1 < (char)(*pbVar10 | bVar1);
        if (bVar17) {
          if (local_a8[uVar15] == 0) {
            bVar16 = bVar1;
            if (bVar1 == 0) {
              bVar16 = 0x80;
            }
            local_a8[uVar15] = bVar16;
          }
          pbVar10 = pbVar10 + 1;
          pbVar13 = pbVar13 + (bVar1 != 0);
        }
        if (!bVar17) goto LAB_0012876b;
      }
      lVar11 = 0;
      do {
        bVar1 = local_a8[lVar11];
        bVar16 = local_a8[lVar11 + 1];
        bVar3 = local_a8[lVar11 + 2];
        bVar4 = local_a8[lVar11 + 3];
        bVar5 = local_a8[lVar11 + 4];
        bVar6 = local_a8[lVar11 + 5];
        bVar7 = local_a8[lVar11 + 6];
        bVar8 = local_a8[lVar11 + 7];
        bVar9 = (byte)lVar11;
        if (bVar1 == 0) {
          local_a8[lVar11] = bVar9;
        }
        if (bVar16 == 0) {
          local_a8[lVar11 + 1] = bVar9 + 1;
        }
        if (bVar3 == 0) {
          local_a8[lVar11 + 2] = bVar9 + 2;
        }
        if (bVar4 == 0) {
          local_a8[lVar11 + 3] = bVar9 + 3;
        }
        if (bVar5 == 0) {
          local_a8[lVar11 + 4] = bVar9 + 4;
        }
        if (bVar6 == 0) {
          local_a8[lVar11 + 5] = bVar9 + 5;
        }
        if (bVar7 == 0) {
          local_a8[lVar11 + 6] = bVar9 + 6;
        }
        if (bVar8 == 0) {
          local_a8[lVar11 + 7] = bVar9 + 7;
        }
        if (bVar1 == 0) {
          local_a8[lVar11 + 8] = bVar9 + 8;
        }
        if (bVar16 == 0) {
          local_a8[lVar11 + 9] = bVar9 + 9;
        }
        if (bVar3 == 0) {
          local_a8[lVar11 + 10] = bVar9 + 10;
        }
        if (bVar4 == 0) {
          local_a8[lVar11 + 0xb] = bVar9 + 0xb;
        }
        if (bVar5 == 0) {
          local_a8[lVar11 + 0xc] = bVar9 + 0xc;
        }
        if (bVar6 == 0) {
          local_a8[lVar11 + 0xd] = bVar9 + 0xd;
        }
        if (bVar7 == 0) {
          local_a8[lVar11 + 0xe] = bVar9 + 0xe;
        }
        if (bVar8 == 0) {
          local_a8[lVar11 + 0xf] = bVar9 + 0xf;
        }
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x80);
      __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
      if (__dest == (char_t *)0x0) {
        __dest = (char_t *)0x0;
      }
      else {
        memcpy(__dest,local_a8,0x80);
      }
LAB_0012876b:
      if (__dest != (char_t *)0x0) {
        this->_type = ':';
        (this->_data).string = __dest;
      }
    }
  }
  else if (bVar1 == 0x38) {
    bVar1 = this->_axis;
    if ((((bVar1 < 0xd) && ((0x1038U >> (bVar1 & 0x1f) & 1) != 0)) &&
        ((pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0 &&
         (((pxVar2->_type == '8' && (pxVar2->_axis == '\x05')) && (pxVar2->_test == '\x02')))))) &&
       (pxVar2->_right == (xpath_ast_node *)0x0)) {
      for (pxVar14 = this->_right; pxVar14 != (xpath_ast_node *)0x0; pxVar14 = pxVar14->_next) {
        if (pxVar14->_test != '\x01') goto LAB_00128777;
      }
      if (pxVar14 == (xpath_ast_node *)0x0) {
        this->_axis = (byte)(bVar1 - 3) < 2 ^ 5;
        this->_left = pxVar2->_left;
      }
    }
  }
LAB_00128777:
  if (((((this->_type == '\x03') && (pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0)) &&
       ((pxVar14 = this->_right, pxVar14 != (xpath_ast_node *)0x0 &&
        (((pxVar2->_type == '8' && (pxVar2->_axis == '\x02')) && (pxVar2->_test == '\x01')))))) &&
      ((pxVar2->_left == (xpath_ast_node *)0x0 && (pxVar2->_right == (xpath_ast_node *)0x0)))) &&
     ((pxVar14->_type == '\x12' || ((pxVar14->_type == '\x14' && (pxVar14->_rettype == '\x03'))))))
  {
    this->_type = ';';
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}